

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_file_getByte(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue obj;
  JSValue JVar1;
  FILE *__stream;
  undefined4 in_ECX;
  int64_t in_RDI;
  JSContext *in_R8;
  FILE *f;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  obj.u._4_4_ = in_ECX;
  obj.u.int32 = in_stack_ffffffffffffffb0;
  obj.tag = in_RDI;
  __stream = (FILE *)js_std_file_get(in_R8,obj);
  if (__stream == (FILE *)0x0) {
    local_30 = 0;
    local_28 = 6;
  }
  else {
    local_30 = fgetc(__stream);
    uStack_2c = uStack_c;
    local_28 = 0;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_std_file_getByte(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    if (!f)
        return JS_EXCEPTION;
    return JS_NewInt32(ctx, fgetc(f));
}